

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

bool __thiscall smf::MidiFile::writeBinascWithComments(MidiFile *this,string *filename)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  undefined1 local_230 [8];
  fstream output;
  ostream local_220 [512];
  string *local_20;
  string *filename_local;
  MidiFile *this_local;
  
  local_20 = filename;
  filename_local = (string *)this;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::fstream::fstream(local_230,pcVar3,_S_out);
  bVar1 = std::fstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error: could not write: ");
    poVar4 = std::operator<<(poVar4,(string *)local_20);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 0;
  }
  else {
    bVar2 = writeBinascWithComments(this,local_220);
    this->m_rwstatus = bVar2;
    std::fstream::close();
    this_local._7_1_ = this->m_rwstatus & 1;
  }
  std::fstream::~fstream(local_230);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MidiFile::writeBinascWithComments(const std::string& filename) {
	std::fstream output(filename.c_str(), std::ios::out);

	if (!output.is_open()) {
		std::cerr << "Error: could not write: " << filename << std::endl;
		return 0;
	}
	m_rwstatus = writeBinascWithComments(output);
	output.close();
	return m_rwstatus;
}